

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O2

void TableSettingsHandler_ClearAll(ImGuiContext *ctx,ImGuiSettingsHandler *param_2)

{
  uint uVar1;
  long lVar2;
  ImGuiContext *g;
  
  uVar1 = (ctx->Tables).Buf.Size;
  for (lVar2 = 0; (ulong)uVar1 * 600 - lVar2 != 0; lVar2 = lVar2 + 600) {
    *(undefined4 *)((long)((ctx->Tables).Buf.Data)->RowBgColor + lVar2 + -0x34) = 0xffffffff;
  }
  ImVector<char>::clear(&(ctx->SettingsTables).Buf);
  return;
}

Assistant:

static void TableSettingsHandler_ClearAll(ImGuiContext* ctx, ImGuiSettingsHandler*)
{
    ImGuiContext& g = *ctx;
    for (int i = 0; i != g.Tables.GetSize(); i++)
        g.Tables.GetByIndex(i)->SettingsOffset = -1;
    g.SettingsTables.clear();
}